

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_context.c
# Opt level: O1

GLFWbool chooseEGLConfig(_GLFWctxconfig *ctxconfig,_GLFWfbconfig *desired,EGLConfig *result)

{
  EGLConfig pvVar1;
  ulong uVar2;
  int iVar3;
  GLFWbool GVar4;
  EGLConfig *__ptr;
  _GLFWfbconfig *alternatives;
  undefined8 *puVar5;
  _GLFWfbconfig *p_Var6;
  uint uVar7;
  long lVar8;
  size_t __nmemb;
  ulong uStack_88;
  int value;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  EGLConfig *local_48;
  int local_40;
  int local_3c;
  int value_2;
  int nativeCount;
  
  _value_2 = 0;
  (*_glfw.egl.GetConfigs)(_glfw.egl.display,(EGLConfig *)0x0,0,&local_3c);
  iVar3 = local_3c;
  if ((long)local_3c == 0) {
    uVar7 = 0;
    _glfwInputError(0x10006,"EGL: No EGLConfigs returned");
  }
  else {
    __ptr = (EGLConfig *)calloc((long)local_3c,8);
    (*_glfw.egl.GetConfigs)(_glfw.egl.display,__ptr,iVar3,&local_3c);
    __nmemb = (size_t)local_3c;
    alternatives = (_GLFWfbconfig *)calloc(__nmemb,0x48);
    if (0 < (long)__nmemb) {
      lVar8 = 0;
      _value_2 = 0;
      local_48 = __ptr;
      do {
        pvVar1 = __ptr[lVar8];
        (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x303f,(EGLint *)&uStack_88);
        if (((int)uStack_88 == 0x308e) &&
           ((*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3033,(EGLint *)&uStack_88),
           (uStack_88 & 4) != 0)) {
          local_58 = 0;
          uStack_50 = 0;
          local_68 = 0;
          uStack_60 = 0;
          local_78 = 0;
          uStack_70 = 0;
          uStack_88 = 0;
          _value = 0;
          (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x302e,&local_40);
          _value = (long)local_40;
          if (_value != 0) {
            p_Var6 = alternatives + value_2;
            if ((desired->transparent != 0) &&
               (puVar5 = (undefined8 *)XGetVisualInfo(_glfw.x11.display,1,&uStack_88,&local_40),
               puVar5 != (undefined8 *)0x0)) {
              GVar4 = _glfwIsVisualTransparentX11((Visual *)*puVar5);
              p_Var6->transparent = GVar4;
              XFree(puVar5);
            }
            if (ctxconfig->client == 0x30001) {
              (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3040,(EGLint *)&uStack_88);
              uVar2 = uStack_88 & 8;
              __ptr = local_48;
joined_r0x001222e4:
              local_48 = __ptr;
              if (uVar2 == 0) goto LAB_00122425;
            }
            else if (ctxconfig->client == 0x30002) {
              if (ctxconfig->major == 1) {
                (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3040,(EGLint *)&uStack_88);
                uVar2 = uStack_88 & 1;
                __ptr = local_48;
              }
              else {
                (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3040,(EGLint *)&uStack_88);
                uVar2 = uStack_88 & 4;
                __ptr = local_48;
              }
              goto joined_r0x001222e4;
            }
            (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3024,(EGLint *)&uStack_88);
            p_Var6->redBits = (int)uStack_88;
            (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3023,(EGLint *)&uStack_88);
            p_Var6->greenBits = (int)uStack_88;
            (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3022,(EGLint *)&uStack_88);
            p_Var6->blueBits = (int)uStack_88;
            (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3021,(EGLint *)&uStack_88);
            p_Var6->alphaBits = (int)uStack_88;
            (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3025,(EGLint *)&uStack_88);
            p_Var6->depthBits = (int)uStack_88;
            (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3026,(EGLint *)&uStack_88);
            p_Var6->stencilBits = (int)uStack_88;
            (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3031,(EGLint *)&uStack_88);
            p_Var6->samples = (int)uStack_88;
            p_Var6->doublebuffer = 1;
            p_Var6->handle = (uintptr_t)pvVar1;
            _value_2 = (ulong)((int)_value_2 + 1);
            __ptr = local_48;
          }
        }
LAB_00122425:
        lVar8 = lVar8 + 1;
      } while (lVar8 < local_3c);
    }
    p_Var6 = _glfwChooseFBConfig(desired,alternatives,(uint)_value_2);
    if (p_Var6 != (_GLFWfbconfig *)0x0) {
      *result = (EGLConfig)p_Var6->handle;
    }
    uVar7 = (uint)(p_Var6 != (_GLFWfbconfig *)0x0);
    free(__ptr);
    free(alternatives);
  }
  return uVar7;
}

Assistant:

static GLFWbool chooseEGLConfig(const _GLFWctxconfig* ctxconfig,
                                const _GLFWfbconfig* desired,
                                EGLConfig* result)
{
    EGLConfig* nativeConfigs;
    _GLFWfbconfig* usableConfigs;
    const _GLFWfbconfig* closest;
    int i, nativeCount, usableCount;

    eglGetConfigs(_glfw.egl.display, NULL, 0, &nativeCount);
    if (!nativeCount)
    {
        _glfwInputError(GLFW_API_UNAVAILABLE, "EGL: No EGLConfigs returned");
        return GLFW_FALSE;
    }

    nativeConfigs = calloc(nativeCount, sizeof(EGLConfig));
    eglGetConfigs(_glfw.egl.display, nativeConfigs, nativeCount, &nativeCount);

    usableConfigs = calloc(nativeCount, sizeof(_GLFWfbconfig));
    usableCount = 0;

    for (i = 0;  i < nativeCount;  i++)
    {
        const EGLConfig n = nativeConfigs[i];
        _GLFWfbconfig* u = usableConfigs + usableCount;

        // Only consider RGB(A) EGLConfigs
        if (getEGLConfigAttrib(n, EGL_COLOR_BUFFER_TYPE) != EGL_RGB_BUFFER)
            continue;

        // Only consider window EGLConfigs
        if (!(getEGLConfigAttrib(n, EGL_SURFACE_TYPE) & EGL_WINDOW_BIT))
            continue;

#if defined(_GLFW_X11)
        {
            XVisualInfo vi = {0};

            // Only consider EGLConfigs with associated Visuals
            vi.visualid = getEGLConfigAttrib(n, EGL_NATIVE_VISUAL_ID);
            if (!vi.visualid)
                continue;

            if (desired->transparent)
            {
                int count;
                XVisualInfo* vis =
                    XGetVisualInfo(_glfw.x11.display, VisualIDMask, &vi, &count);
                if (vis)
                {
                    u->transparent = _glfwIsVisualTransparentX11(vis[0].visual);
                    XFree(vis);
                }
            }
        }
#endif // _GLFW_X11

        if (ctxconfig->client == GLFW_OPENGL_ES_API)
        {
            if (ctxconfig->major == 1)
            {
                if (!(getEGLConfigAttrib(n, EGL_RENDERABLE_TYPE) & EGL_OPENGL_ES_BIT))
                    continue;
            }
            else
            {
                if (!(getEGLConfigAttrib(n, EGL_RENDERABLE_TYPE) & EGL_OPENGL_ES2_BIT))
                    continue;
            }
        }
        else if (ctxconfig->client == GLFW_OPENGL_API)
        {
            if (!(getEGLConfigAttrib(n, EGL_RENDERABLE_TYPE) & EGL_OPENGL_BIT))
                continue;
        }

        u->redBits = getEGLConfigAttrib(n, EGL_RED_SIZE);
        u->greenBits = getEGLConfigAttrib(n, EGL_GREEN_SIZE);
        u->blueBits = getEGLConfigAttrib(n, EGL_BLUE_SIZE);

        u->alphaBits = getEGLConfigAttrib(n, EGL_ALPHA_SIZE);
        u->depthBits = getEGLConfigAttrib(n, EGL_DEPTH_SIZE);
        u->stencilBits = getEGLConfigAttrib(n, EGL_STENCIL_SIZE);

        u->samples = getEGLConfigAttrib(n, EGL_SAMPLES);
        u->doublebuffer = GLFW_TRUE;

        u->handle = (uintptr_t) n;
        usableCount++;
    }

    closest = _glfwChooseFBConfig(desired, usableConfigs, usableCount);
    if (closest)
        *result = (EGLConfig) closest->handle;

    free(nativeConfigs);
    free(usableConfigs);

    return closest != NULL;
}